

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::lineLineIntersect
               (Vector<long,_2> *line0Beg,Vector<long,_2> *line0End,Vector<long,_2> *line1Beg,
               Vector<long,_2> *line1End)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  deInt64 crossProduct1_1;
  deInt64 crossProduct0_1;
  I64Vec2 v1_1;
  I64Vec2 v0_1;
  I64Vec2 line_1;
  deInt64 crossProduct1;
  deInt64 crossProduct0;
  I64Vec2 v1;
  I64Vec2 v0;
  I64Vec2 line;
  Vector<long,_2> *line1End_local;
  Vector<long,_2> *line1Beg_local;
  Vector<long,_2> *line0End_local;
  Vector<long,_2> *line0Beg_local;
  
  tcu::operator-((tcu *)(v0.m_data + 1),line0End,line0Beg);
  tcu::operator-((tcu *)(v1.m_data + 1),line1Beg,line0Beg);
  tcu::operator-((tcu *)&crossProduct0,line1End,line0Beg);
  lVar1 = Vector<long,_2>::x((Vector<long,_2> *)(v0.m_data + 1));
  lVar2 = Vector<long,_2>::y((Vector<long,_2> *)(v1.m_data + 1));
  lVar3 = Vector<long,_2>::y((Vector<long,_2> *)(v0.m_data + 1));
  lVar4 = Vector<long,_2>::x((Vector<long,_2> *)(v1.m_data + 1));
  lVar1 = lVar1 * lVar2 - lVar3 * lVar4;
  lVar2 = Vector<long,_2>::x((Vector<long,_2> *)(v0.m_data + 1));
  lVar3 = Vector<long,_2>::y((Vector<long,_2> *)&crossProduct0);
  lVar4 = Vector<long,_2>::y((Vector<long,_2> *)(v0.m_data + 1));
  lVar5 = Vector<long,_2>::x((Vector<long,_2> *)&crossProduct0);
  lVar2 = lVar2 * lVar3 - lVar4 * lVar5;
  if (((lVar1 < 0) && (lVar2 < 0)) || ((0 < lVar1 && (0 < lVar2)))) {
    line0Beg_local._7_1_ = false;
  }
  else {
    tcu::operator-((tcu *)(v0_1.m_data + 1),line1End,line1Beg);
    tcu::operator-((tcu *)(v1_1.m_data + 1),line0Beg,line1Beg);
    tcu::operator-((tcu *)&crossProduct0_1,line0End,line1Beg);
    lVar1 = Vector<long,_2>::x((Vector<long,_2> *)(v0_1.m_data + 1));
    lVar2 = Vector<long,_2>::y((Vector<long,_2> *)(v1_1.m_data + 1));
    lVar3 = Vector<long,_2>::y((Vector<long,_2> *)(v0_1.m_data + 1));
    lVar4 = Vector<long,_2>::x((Vector<long,_2> *)(v1_1.m_data + 1));
    lVar1 = lVar1 * lVar2 - lVar3 * lVar4;
    lVar2 = Vector<long,_2>::x((Vector<long,_2> *)(v0_1.m_data + 1));
    lVar3 = Vector<long,_2>::y((Vector<long,_2> *)&crossProduct0_1);
    lVar4 = Vector<long,_2>::y((Vector<long,_2> *)(v0_1.m_data + 1));
    lVar5 = Vector<long,_2>::x((Vector<long,_2> *)&crossProduct0_1);
    lVar2 = lVar2 * lVar3 - lVar4 * lVar5;
    if (((lVar1 < 0) && (lVar2 < 0)) || ((0 < lVar1 && (0 < lVar2)))) {
      line0Beg_local._7_1_ = false;
    }
    else {
      line0Beg_local._7_1_ = true;
    }
  }
  return line0Beg_local._7_1_;
}

Assistant:

bool lineLineIntersect (const tcu::Vector<deInt64, 2>& line0Beg, const tcu::Vector<deInt64, 2>& line0End, const tcu::Vector<deInt64, 2>& line1Beg, const tcu::Vector<deInt64, 2>& line1End)
{
	typedef tcu::Vector<deInt64, 2> I64Vec2;

	// Lines do not intersect if the other line's endpoints are on the same side
	// otherwise, the do intersect

	// Test line 0
	{
		const I64Vec2 line			= line0End - line0Beg;
		const I64Vec2 v0			= line1Beg - line0Beg;
		const I64Vec2 v1			= line1End - line0Beg;
		const deInt64 crossProduct0	= (line.x() * v0.y() - line.y() * v0.x());
		const deInt64 crossProduct1	= (line.x() * v1.y() - line.y() * v1.x());

		// check signs
		if ((crossProduct0 < 0 && crossProduct1 < 0) ||
			(crossProduct0 > 0 && crossProduct1 > 0))
			return false;
	}

	// Test line 1
	{
		const I64Vec2 line			= line1End - line1Beg;
		const I64Vec2 v0			= line0Beg - line1Beg;
		const I64Vec2 v1			= line0End - line1Beg;
		const deInt64 crossProduct0	= (line.x() * v0.y() - line.y() * v0.x());
		const deInt64 crossProduct1	= (line.x() * v1.y() - line.y() * v1.x());

		// check signs
		if ((crossProduct0 < 0 && crossProduct1 < 0) ||
			(crossProduct0 > 0 && crossProduct1 > 0))
			return false;
	}

	return true;
}